

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O2

int cpoly(double *OPR,double *OPI,int DEGREE,double *ZEROR,double *ZEROI)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *HR;
  uint uVar6;
  double *HI;
  void *__ptr;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  int iVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int NN;
  ulong uVar18;
  int iVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  double *pdVar23;
  double *pdVar24;
  double dVar25;
  double dVar26;
  double local_178;
  int N;
  double local_128;
  double prt;
  double pit;
  double ZR;
  double ZI;
  ulong local_100;
  double local_f8;
  double local_f0;
  double PVI;
  double *local_e0;
  ulong local_d8;
  double local_d0;
  double SR;
  double PVR;
  double *local_b8;
  ulong local_b0;
  double *local_a8;
  undefined8 uStack_a0;
  int local_94;
  double dStack_90;
  int CONV;
  double SI;
  double *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  double *local_68;
  int local_5c;
  double dStack_58;
  int BOOL;
  double TR;
  double TI;
  double *local_40;
  double *local_38;
  
  uVar18 = (ulong)(uint)DEGREE;
  local_a8 = OPI;
  TI = (double)OPR;
  local_38 = (double *)malloc(800);
  local_68 = (double *)malloc(800);
  local_40 = (double *)malloc(800);
  HI = (double *)malloc(800);
  SI = (double)malloc(800);
  local_80 = (double *)malloc(800);
  PVR = (double)malloc(800);
  local_b8 = (double *)malloc(800);
  __ptr = malloc(800);
  local_e0 = (double *)malloc(800);
  iVar12 = 0;
  dVar1 = macheps();
  if ((((*(double *)TI != 0.0) || (NAN(*(double *)TI))) || (*local_a8 != 0.0)) || (NAN(*local_a8)))
  {
    lVar15 = (long)(DEGREE + 1);
    lVar16 = lVar15 << 0x20;
    lVar7 = 0;
    while (((dVar22 = *(double *)((long)TI + lVar15 * 8 + -8 + lVar7 * 8), dVar22 == 0.0 &&
            (!NAN(dVar22))) &&
           ((local_a8[lVar15 + lVar7 + -1] == 0.0 && (!NAN(local_a8[lVar15 + lVar7 + -1])))))) {
      ZEROR[iVar12] = 0.0;
      ZEROI[iVar12] = 0.0;
      lVar7 = lVar7 + -1;
      lVar16 = lVar16 + -0x100000000;
      iVar12 = iVar12 + 1;
    }
    uVar14 = uVar18 + lVar7 + 1;
    local_100 = uVar18 + lVar7;
    local_b0 = lVar15 + lVar7;
    pdVar8 = local_68;
    pdVar10 = local_38;
    local_f8 = dVar1;
    PVI = dVar1;
    local_d8 = uVar18;
    for (lVar7 = 0; pdVar13 = local_68, uVar18 = local_b0, lVar7 < lVar16 >> 0x20; lVar7 = lVar7 + 1
        ) {
      *pdVar10 = *(double *)((long)TI + lVar7 * 8);
      *pdVar8 = local_a8[lVar7];
      local_78 = pdVar10;
      dVar22 = CMOD(pdVar10,pdVar8);
      *(double *)((long)__ptr + lVar7 * 8) = dVar22;
      pdVar8 = pdVar8 + 1;
      pdVar10 = local_78 + 1;
    }
    uVar9 = 0;
    uVar11 = uVar14 & 0xffffffff;
    if ((int)uVar14 < 1) {
      uVar11 = uVar9;
    }
    uVar20 = 0;
    uVar21 = 0;
    pdVar8 = (double *)0x7fefffffffffffff;
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      pdVar10 = *(double **)((long)__ptr + uVar9 * 8);
      pdVar24 = pdVar10;
      if ((double)pdVar10 == 0.0 || (double)pdVar8 <= (double)pdVar10) {
        pdVar24 = pdVar8;
      }
      if ((double)pdVar10 <= (double)CONCAT44(uVar21,uVar20)) {
        pdVar10 = (double *)CONCAT44(uVar21,uVar20);
      }
      uVar20 = SUB84(pdVar10,0);
      uVar21 = (undefined4)((ulong)pdVar10 >> 0x20);
      pdVar8 = pdVar24;
    }
    if (((double)pdVar8 < 2.2250738585072014e-308 / local_f8) ||
       (1.3407807929942596e+154 < (double)CONCAT44(uVar21,uVar20))) {
      dVar22 = (2.2250738585072014e-308 / local_f8) / (double)pdVar8;
      if (dVar22 <= 1.0) {
        if ((double)CONCAT44(uVar21,uVar20) < 0.0) {
          uStack_70 = 0;
          local_78 = pdVar8;
          pdVar10 = (double *)sqrt((double)CONCAT44(uVar21,uVar20));
          pdVar8 = local_78;
        }
        else {
          pdVar10 = (double *)SQRT((double)CONCAT44(uVar21,uVar20));
        }
        if ((double)pdVar8 < 0.0) {
          local_78 = pdVar10;
          dVar22 = sqrt((double)pdVar8);
          pdVar10 = local_78;
        }
        else {
          dVar22 = SQRT((double)pdVar8);
        }
        dVar22 = 1.0 / ((double)pdVar10 * dVar22);
      }
      else if ((double)CONCAT44(uVar21,uVar20) <= 1.79769313486232e+308 / dVar22 &&
               1.79769313486232e+308 / dVar22 != (double)CONCAT44(uVar21,uVar20)) {
        dVar22 = 1.0;
      }
      dVar22 = log(dVar22);
      dVar22 = exp2(dVar22 / 0.6931471805599453 + 0.5);
      if ((dVar22 != 1.0) || (NAN(dVar22))) {
        for (lVar7 = 0; lVar7 < lVar16 >> 0x20; lVar7 = lVar7 + 1) {
          local_38[lVar7] = local_38[lVar7] * dVar22;
          pdVar13[lVar7] = pdVar13[lVar7] * dVar22;
        }
      }
    }
    local_f8 = local_f8 * 10.0;
    dVar22 = 0.70710678;
    local_178 = -0.70710678;
    ZI = (double)__ptr;
    while (__ptr = (void *)ZI, 2 < (long)uVar18) {
      lVar7 = (local_100 & 0xffffffff) - 1;
      pdVar10 = (double *)0x0;
      pdVar8 = local_38;
      TI = dVar22;
      while ((long)pdVar10 < (long)uVar18) {
        local_78 = pdVar10;
        dVar22 = CMOD(pdVar8,pdVar13);
        *(double *)((long)__ptr + (long)local_78 * 8) = dVar22;
        pdVar13 = pdVar13 + 1;
        pdVar8 = pdVar8 + 1;
        pdVar10 = (double *)((long)local_78 + 1);
      }
      uVar14 = uVar18 - 1;
      dVar22 = *(double *)((long)__ptr + -8 + uVar18 * 8);
      *(double *)((long)__ptr + -8 + uVar18 * 8) = -dVar22;
      local_a8 = (double *)log(dVar22);
      local_78 = *__ptr;
      dVar2 = log((double)local_78);
      pdVar8 = (double *)(double)(int)uVar14;
      dVar25 = exp(((double)local_a8 - dVar2) / (double)pdVar8);
      pdVar13 = local_68;
      dVar2 = *(double *)((long)__ptr + -0x10 + uVar18 * 8);
      if (((dVar2 != 0.0) || (NAN(dVar2))) && (dVar22 / dVar2 < dVar25)) {
        dVar25 = dVar22 / dVar2;
      }
      pdVar10 = local_78;
      for (uVar6 = 0; (0.0 < (double)pdVar10 && (uVar6 < 1000)); uVar6 = uVar6 + 1) {
        pdVar10 = local_78;
        for (uVar11 = 1; uVar11 < uVar18; uVar11 = uVar11 + 1) {
          pdVar10 = (double *)
                    ((double)pdVar10 * dVar25 * 0.1 + *(double *)((long)__ptr + uVar11 * 8));
        }
        dVar25 = dVar25 * 0.1;
      }
      dVar22 = dVar25;
      for (uVar6 = 0; (0.005 < ABS(dVar22 / dVar25) && (uVar6 < 1000)); uVar6 = uVar6 + 1) {
        *local_e0 = (double)local_78;
        for (uVar11 = 1; uVar11 < uVar18; uVar11 = uVar11 + 1) {
          local_e0[uVar11] = local_e0[uVar11 - 1] * dVar25 + *(double *)((long)__ptr + uVar11 * 8);
        }
        pdVar10 = local_78;
        for (lVar15 = 1; lVar15 < (long)uVar14; lVar15 = lVar15 + 1) {
          pdVar10 = (double *)((double)pdVar10 * dVar25 + local_e0[lVar15]);
        }
        dVar22 = local_e0[uVar14] / (double)pdVar10;
        dVar25 = dVar25 - dVar22;
      }
      pdVar24 = local_40 + (uVar18 - 2);
      lVar15 = uVar18 - 2;
      dVar22 = CMOD(local_38 + (uVar18 - 2),local_68 + (uVar18 - 2));
      pdVar10 = (double *)(dVar22 * local_f8);
      iVar12 = 1;
      local_b0 = uVar18;
LAB_001276a9:
      if (iVar12 == 3) {
        iVar12 = 1;
        goto LAB_00127f2b;
      }
      uVar9 = local_100;
      for (uVar11 = 1; uVar11 < uVar18; uVar11 = uVar11 + 1) {
        dVar22 = (double)(int)uVar9;
        local_40[uVar11 - 1] = (local_38[uVar11 - 1] * dVar22) / (double)pdVar8;
        HI[uVar11 - 1] = (dVar22 * pdVar13[uVar11 - 1]) / (double)pdVar8;
        uVar9 = (ulong)((int)uVar9 - 1);
      }
      for (iVar17 = 0; iVar17 != 5; iVar17 = iVar17 + 1) {
        dVar22 = CMOD(pdVar24,HI + lVar15);
        lVar16 = lVar7;
        if (dVar22 <= (double)pdVar10) {
          while (lVar16 != 0) {
            iVar19 = (int)lVar16;
            local_40[iVar19] = local_40[iVar19 + -1];
            HI[iVar19] = HI[iVar19 + -1];
            lVar16 = lVar16 + -1;
          }
          uVar20 = 0;
          uVar21 = 0;
          pdVar23 = (double *)0x0;
        }
        else {
          local_78 = (double *)*local_38;
          uStack_70 = 0;
          local_128 = -(double)local_78;
          local_a8 = (double *)*pdVar13;
          uStack_a0 = 0;
          prt = -(double)local_a8;
          CDIVID(&local_128,&prt,pdVar24,HI + lVar15,1.79769313486232e+308,&stack0xffffffffffffffa8,
                 &TR);
          while (lVar16 != 0) {
            iVar19 = (int)lVar16;
            dVar22 = HI[iVar19 + -1];
            local_40[iVar19] = dStack_58 * local_40[iVar19 + -1] + dVar22 * -TR + local_38[iVar19];
            HI[iVar19] = dVar22 * dStack_58 + local_40[iVar19 + -1] * TR + pdVar13[iVar19];
            lVar16 = lVar16 + -1;
          }
          uVar20 = (int)local_78;
          uVar21 = local_78._4_4_;
          pdVar23 = local_a8;
        }
        *local_40 = (double)CONCAT44(uVar21,uVar20);
        *HI = (double)pdVar23;
      }
      iVar17 = 1;
      uVar18 = local_b0;
      do {
        if (iVar17 == 10) goto LAB_00127e27;
        dVar22 = TI * -0.060756474 + local_178 * -0.99756405;
        local_178 = TI * 0.99756405 + local_178 * -0.060756474;
        dVar2 = dVar25 * dVar22;
        dVar26 = dVar25 * local_178;
        pdVar23 = (double *)(ulong)(uint)(iVar17 * 10);
        local_d0 = dVar2;
        dStack_90 = dVar26;
        POLYEV((int)uVar18,&local_d0,&stack0xffffffffffffff70,local_38,pdVar13,(double *)SI,local_80
               ,&SR,&local_f0);
        CALCT(&local_5c,(int)uVar18,&local_d0,&stack0xffffffffffffff70,local_40,HI,(double *)PVR,
              local_b8,PVI,1.79769313486232e+308,&SR,&local_f0,&stack0xffffffffffffffa8,&TR);
        uVar20 = 0;
        local_a8 = (double *)CONCAT44(local_a8._4_4_,1);
        for (iVar19 = 0; HR = local_40, dVar5 = TR, dVar4 = dStack_58, pdVar13 = local_b8,
            dVar3 = PVR, iVar19 != (int)pdVar23; iVar19 = iVar19 + 1) {
          TI = (double)CONCAT44(TI._4_4_,uVar20);
          local_78 = (double *)CONCAT44(local_78._4_4_,iVar19);
          NEXTH(&local_5c,(int)uVar18,(double *)PVR,local_b8,(double *)SI,local_80,
                &stack0xffffffffffffffa8,&TR,local_40,HI);
          CALCT(&local_5c,(int)uVar18,&local_d0,&stack0xffffffffffffff70,HR,HI,(double *)dVar3,
                pdVar13,PVI,1.79769313486232e+308,&SR,&local_f0,&stack0xffffffffffffffa8,&TR);
          pit = dVar2 + dStack_58;
          ZR = dVar26 + TR;
          iVar19 = (int)local_78;
          uVar18 = local_b0;
          uVar20 = TI._0_4_;
          if ((int)local_a8 != 0 && local_5c != 1) {
            if ((int)local_78 == iVar17 * 10 - 1U) {
              local_a8 = (double *)CONCAT44(local_a8._4_4_,1);
            }
            else {
              local_128 = dStack_58 - dVar4;
              prt = TR - dVar5;
              local_a8 = (double *)CMOD(&local_128,&prt);
              dVar3 = CMOD(&pit,&ZR);
              pdVar13 = local_a8;
              uVar18 = local_b0;
              local_a8 = (double *)CONCAT44(local_a8._4_4_,1);
              uVar20 = 0;
              if ((double)pdVar13 < dVar3 * 0.5) {
                local_a8 = (double *)CONCAT44(local_a8._4_4_,1);
                uVar20 = 1;
                if (TI._0_4_ == 1) {
                  for (uVar11 = 1; local_b0 != uVar11; uVar11 = uVar11 + 1) {
                    *(double *)((long)ZI + -8 + uVar11 * 8) = local_40[uVar11 - 1];
                    local_e0[uVar11 - 1] = HI[uVar11 - 1];
                  }
                  NN = (int)local_b0;
                  VRSHFT(NN,(int)&pit,&ZR,(double *)&local_94,(int *)&local_d0,
                         &stack0xffffffffffffff70,local_38,local_68,(double *)SI,local_80,&SR,
                         &local_f0,local_40,PVI,dVar1 * 2.8284271247461903,PVI,1.79769313486232e+308
                         ,HI,(double *)PVR,local_b8,&stack0xffffffffffffffa8,&TR,pdVar23,pdVar8,
                         pdVar10);
                  pdVar13 = local_40;
                  if (local_94 == 1) break;
                  for (uVar11 = 1; uVar18 != uVar11; uVar11 = uVar11 + 1) {
                    local_40[uVar11 - 1] = *(double *)((long)ZI + -8 + uVar11 * 8);
                    HI[uVar11 - 1] = local_e0[uVar11 - 1];
                  }
                  local_d0 = dVar2;
                  dStack_90 = dVar26;
                  POLYEV(NN,&local_d0,&stack0xffffffffffffff70,local_38,local_68,(double *)SI,
                         local_80,&SR,&local_f0);
                  iVar19 = (int)local_78;
                  CALCT(&local_5c,NN,&local_d0,&stack0xffffffffffffff70,pdVar13,HI,(double *)PVR,
                        local_b8,PVI,1.79769313486232e+308,&SR,&local_f0,&stack0xffffffffffffffa8,
                        &TR);
                  local_a8 = (double *)((ulong)local_a8 & 0xffffffff00000000);
                  uVar20 = 1;
                }
              }
            }
          }
        }
        pdVar13 = local_68;
        VRSHFT((int)uVar18,(int)&pit,&ZR,(double *)&local_94,(int *)&local_d0,
               &stack0xffffffffffffff70,local_38,local_68,(double *)SI,local_80,&SR,&local_f0,
               local_40,PVI,dVar1 * 2.8284271247461903,PVI,1.79769313486232e+308,HI,(double *)PVR,
               local_b8,&stack0xffffffffffffffa8,&TR,pdVar23,pdVar8,pdVar10);
        iVar17 = iVar17 + 1;
        TI = dVar22;
      } while (local_94 != 1);
      iVar12 = (DEGREE + 1) - (int)uVar18;
      ZEROR[iVar12] = pit;
      ZEROI[iVar12] = ZR;
      for (lVar7 = 0; lVar7 < (long)uVar14; lVar7 = lVar7 + 1) {
        local_38[lVar7] = *(double *)((long)SI + lVar7 * 8);
        pdVar13[lVar7] = local_80[lVar7];
      }
      local_100 = (ulong)((int)local_100 - 1);
      uVar18 = uVar14;
    }
    local_128 = -local_38[1];
    prt = -pdVar13[1];
    CDIVID(&local_128,&prt,local_38,pdVar13,1.79769313486232e+308,ZEROR + (long)(int)local_d8 + -1,
           ZEROI + (long)(int)local_d8 + -1);
    iVar12 = 0;
  }
  else {
    iVar12 = 1;
    pdVar13 = local_68;
  }
LAB_00127f2b:
  free(local_38);
  free(pdVar13);
  free(local_40);
  free(HI);
  free((void *)SI);
  free(local_80);
  free((void *)PVR);
  free(local_b8);
  free(__ptr);
  free(local_e0);
  return iVar12;
LAB_00127e27:
  iVar12 = iVar12 + 1;
  __ptr = (void *)ZI;
  goto LAB_001276a9;
}

Assistant:

int cpoly(double *OPR, double *OPI, int DEGREE, double *ZEROR, double *ZEROI) {
	/* FINDS THE ZEROS OF A COMPLEX POLYNOMIAL.
	C OPR, OPI  -  DOUBLE PRECISION VECTORS OF REAL AND
	C IMAGINARY PARTS OF THE COEFFICIENTS IN
	C ORDER OF DECREASING POWERS.
	C DEGREE    -  INTEGER DEGREE OF POLYNOMIAL.
	C ZEROR, ZEROI  -  OUTPUT DOUBLE PRECISION VECTORS OF
	C REAL AND IMAGINARY PARTS OF THE ZEROS.
	C FAIL      -  OUTPUT LOGICAL PARAMETER,  TRUE  ONLY IF
	C LEADING COEFFICIENT IS ZERO OR IF CPOLY
	C HAS FOUND FEWER THAN DEGREE ZEROS.
	C THE PROGRAM HAS BEEN WRITTEN TO REDUCE THE CHANCE OF OVERFLOW
	C OCCURRING. IF IT DOES OCCUR, THERE IS STILL A POSSIBILITY THAT
	C THE ZEROFINDER WILL WORK PROVIDED THE OVERFLOWED QUANTITY IS
	C REPLACED BY A LARGE NUMBER.*/
	int fail,CONV;
	double *PR, *PI, *HR, *HI, *QPR, *QPI, *QHR, *QHI, *SHR, *SHI;
	double SR, SI, TR, TI, PVR, PVI, ARE, MRE, ETA, INFIN;
	double XX, YY, COSR, SINR, SMALNO, BASE, XXX, ZR, ZI, BND;
	int NN,CNT1,CNT2,IDNN2,i;
	double prt, pit;

	PR = (double*)malloc(sizeof(double)* 100);
	PI = (double*)malloc(sizeof(double)* 100);
	HR = (double*)malloc(sizeof(double)* 100);
	HI = (double*)malloc(sizeof(double)* 100);
	QPR = (double*)malloc(sizeof(double)* 100);
	QPI = (double*)malloc(sizeof(double)* 100);
	QHR = (double*)malloc(sizeof(double)* 100);
	QHI = (double*)malloc(sizeof(double)* 100);
	SHR = (double*)malloc(sizeof(double)* 100);
	SHI = (double*)malloc(sizeof(double)* 100);

	mcon(&ETA, &INFIN, &SMALNO, &BASE);

	ARE = ETA;
	MRE = 2.0*sqrt(2.0)*ETA;
	XX = .70710678;
	YY = -XX;
	COSR = -.060756474;
	SINR = .99756405;
	fail = 0;
	NN = DEGREE + 1;

	if (!(OPR[0] != 0.0 || OPI[0] != 0.0)) {
		fail = 1;
		free(PR);
		free(PI);
		free(HR);
		free(HI);
		free(QPR);
		free(QPI);
		free(QHR);
		free(QHI);
		free(SHR);
		free(SHI);
		return fail;
	}

	while (!(OPR[NN - 1] != 0.0 || OPI[NN - 1] != 0.0)) {
		IDNN2 = DEGREE - NN + 2;
		ZEROR[IDNN2 - 1] = 0.0;
		ZEROI[IDNN2 - 1] = 0.0;
		NN = NN - 1;
	}

	for (i = 0; i < NN; ++i) {
		PR[i] = OPR[i];
		PI[i] = OPI[i];
		SHR[i] = CMOD(&PR[i], &PI[i]);
	}

	BND = RESCALE(NN, SHR, ETA, INFIN, SMALNO, BASE);

	if (BND != 1.0) {
		for (i = 0; i < NN; ++i) {
			PR[i] = BND*PR[i];
			PI[i] = BND*PI[i];
		}
	}

	NNITER: if (NN <= 2) {
				prt = -1.0 * PR[1];
				pit = -1.0 * PI[1];
				CDIVID(&prt, &pit, &PR[0], &PI[0], INFIN, &ZEROR[DEGREE - 1], &ZEROI[DEGREE - 1]);
				free(PR);
				free(PI);
				free(HR);
				free(HI);
				free(QPR);
				free(QPI);
				free(QHR);
				free(QHI);
				free(SHR);
				free(SHI);
				return fail;
			}

	for (i = 0; i < NN; ++i) {
		SHR[i] = CMOD(&PR[i], &PI[i]);
	}

	BND = CAUCHY(NN, SHR, SHI);

	/*
	C OUTER LOOP TO CONTROL 2 MAJOR PASSES WITH DIFFERENT SEQUENCES
	C OF SHIFTS.
	*/

	for (CNT1 = 1; CNT1 <= 2; ++CNT1) {
		//C FIRST STAGE CALCULATION, NO SHIFT.
		NOSHFT(NN, 5, &SR, &SI, PR, PI, QPR, QPI, &PVR, &PVI, ARE, MRE, ETA, INFIN, HR, HI, QHR, QHI, SHR, SHI, &TR, &TI);
		//C INNER LOOP TO SELECT A SHIFT.
		for (CNT2 = 1; CNT2 <= 9; ++CNT2) {
			//C SHIFT IS CHOSEN WITH MODULUS BND AND AMPLITUDE ROTATED BY
			//C 94 DEGREES FROM THE PREVIOUS SHIFT
			XXX = COSR*XX - SINR*YY;
			YY = SINR*XX + COSR*YY;
			XX = XXX;
			SR = BND*XX;
			SI = BND*YY;
			//C SECOND STAGE CALCULATION, FIXED SHIFT.
			FXSHFT(NN, 10*CNT2, &ZR, &ZI, &CONV, &SR, &SI, PR, PI, QPR, QPI, &PVR, &PVI, ARE, MRE, ETA, INFIN, HR, HI, QHR, QHI, SHR, SHI, &TR, &TI);
			if (CONV == 1) {
				//C THE SECOND STAGE JUMPS DIRECTLY TO THE THIRD STAGE ITERATION.
				//C IF SUCCESSFUL THE ZERO IS STORED AND THE POLYNOMIAL DEFLATED.
				IDNN2 = DEGREE - NN + 2;
				ZEROR[IDNN2 - 1] = ZR;
				ZEROI[IDNN2 - 1] = ZI;
				NN = NN - 1;
				for (i = 0; i < NN; ++i) {
					PR[i] = QPR[i];
					PI[i] = QPI[i];
				}
				goto NNITER;
			}//80
		}
	}

	fail = 1;

	free(PR);
	free(PI);
	free(HR);
	free(HI);
	free(QPR);
	free(QPI);
	free(QHR);
	free(QHI);
	free(SHR);
	free(SHI);
	return fail;
}